

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::WeakCrossingSIVTest
          (LoopDependenceAnalysis *this,SENode *source,SENode *destination,SENode *coefficient,
          DistanceEntry *distance_entry)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SENode *pSVar2;
  undefined4 extraout_var_02;
  SENode *operand_2;
  undefined4 extraout_var_03;
  float fVar3;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  int64_t local_e0;
  int64_t coefficient_value;
  int64_t delta_value;
  string local_c8;
  SEConstantNode *local_a8;
  SEConstantNode *coefficient_constant;
  SEConstantNode *delta_constant;
  int64_t distance;
  SENode *offset_delta;
  string local_80;
  allocator<char> local_59;
  string local_58;
  DistanceEntry *local_38;
  DistanceEntry *distance_entry_local;
  SENode *coefficient_local;
  SENode *destination_local;
  SENode *source_local;
  LoopDependenceAnalysis *this_local;
  
  local_38 = distance_entry;
  distance_entry_local = (DistanceEntry *)coefficient;
  coefficient_local = destination;
  destination_local = source;
  source_local = (SENode *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Performing WeakCrossingSIVTest.",&local_59);
  PrintDebug(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  iVar1 = (*destination_local->_vptr_SENode[6])();
  if ((CONCAT44(extraout_var,iVar1) == 0) ||
     (iVar1 = (*coefficient_local->_vptr_SENode[6])(), CONCAT44(extraout_var_00,iVar1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "WeakCrossingSIVTest found source or destination != SERecurrentNode. Exiting",
               (allocator<char> *)((long)&offset_delta + 7));
    PrintDebug(this,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&offset_delta + 7));
    local_38->direction = ALL;
    return false;
  }
  iVar1 = (*coefficient_local->_vptr_SENode[6])();
  pSVar2 = SERecurrentNode::GetOffset((SERecurrentNode *)CONCAT44(extraout_var_01,iVar1));
  iVar1 = (*destination_local->_vptr_SENode[6])();
  operand_2 = SERecurrentNode::GetOffset((SERecurrentNode *)CONCAT44(extraout_var_02,iVar1));
  pSVar2 = ScalarEvolutionAnalysis::CreateSubtraction(&this->scalar_evolution_,pSVar2,operand_2);
  distance = (int64_t)ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar2);
  delta_constant = (SEConstantNode *)0x0;
  iVar1 = (*((SENode *)distance)->_vptr_SENode[4])();
  coefficient_constant = (SEConstantNode *)CONCAT44(extraout_var_03,iVar1);
  local_a8 = (SEConstantNode *)(**(code **)(*(long *)distance_entry_local + 0x20))();
  if ((coefficient_constant == (SEConstantNode *)0x0) || (local_a8 == (SEConstantNode *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,
               "WeakCrossingSIVTest was unable to fold offset_delta and coefficient to constants.",
               &local_151);
    PrintDebug(this,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,
               "WeakCrossingSIVTest folding offset_delta and coefficient to constants.",
               (allocator<char> *)((long)&delta_value + 7));
    PrintDebug(this,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&delta_value + 7));
    coefficient_value = SEConstantNode::FoldToSingleValue(coefficient_constant);
    local_e0 = SEConstantNode::FoldToSingleValue(local_a8);
    if ((coefficient_value % (local_e0 << 1) != 0) &&
       ((fVar3 = (float)(coefficient_value % (local_e0 << 1)) / (float)(local_e0 << 1), fVar3 != 0.5
        || (NAN(fVar3))))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,
                 "WeakCrossingSIVTest proved independence through distance escaping the loop bounds."
                 ,&local_101);
      PrintDebug(this,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      local_38->dependence_information = DIRECTION;
      local_38->direction = NONE;
      return true;
    }
    delta_constant = (SEConstantNode *)(coefficient_value / (local_e0 << 1));
    if (delta_constant == (SEConstantNode *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"WeakCrossingSIVTest found EQ dependence.",&local_129);
      PrintDebug(this,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      local_38->dependence_information = DISTANCE;
      local_38->direction = EQ;
      local_38->distance = 0;
      return false;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,
             "WeakCrossingSIVTest was unable to determine any dependence information.",&local_179);
  PrintDebug(this,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  local_38->direction = ALL;
  return false;
}

Assistant:

bool LoopDependenceAnalysis::WeakCrossingSIVTest(
    SENode* source, SENode* destination, SENode* coefficient,
    DistanceEntry* distance_entry) {
  PrintDebug("Performing WeakCrossingSIVTest.");
  // We currently can't handle symbolic WeakCrossingSIVTests. If either source
  // or destination are not SERecurrentNodes we must exit.
  if (!source->AsSERecurrentNode() || !destination->AsSERecurrentNode()) {
    PrintDebug(
        "WeakCrossingSIVTest found source or destination != SERecurrentNode. "
        "Exiting");
    distance_entry->direction = DistanceEntry::Directions::ALL;
    return false;
  }

  // Build an SENode for distance.
  SENode* offset_delta =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateSubtraction(
          destination->AsSERecurrentNode()->GetOffset(),
          source->AsSERecurrentNode()->GetOffset()));

  // Scalar evolution doesn't perform division, so we must fold to constants and
  // do it manually.
  int64_t distance = 0;
  SEConstantNode* delta_constant = offset_delta->AsSEConstantNode();
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (delta_constant && coefficient_constant) {
    PrintDebug(
        "WeakCrossingSIVTest folding offset_delta and coefficient to "
        "constants.");
    int64_t delta_value = delta_constant->FoldToSingleValue();
    int64_t coefficient_value = coefficient_constant->FoldToSingleValue();
    // Check if the distance is not integral or if it has a non-integral part
    // equal to 1/2.
    if (delta_value % (2 * coefficient_value) != 0 &&
        static_cast<float>(delta_value % (2 * coefficient_value)) /
                static_cast<float>(2 * coefficient_value) !=
            0.5) {
      PrintDebug(
          "WeakCrossingSIVTest proved independence through distance escaping "
          "the loop bounds.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    } else {
      distance = delta_value / (2 * coefficient_value);
    }

    if (distance == 0) {
      PrintDebug("WeakCrossingSIVTest found EQ dependence.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DISTANCE;
      distance_entry->direction = DistanceEntry::Directions::EQ;
      distance_entry->distance = 0;
      return false;
    }
  } else {
    PrintDebug(
        "WeakCrossingSIVTest was unable to fold offset_delta and coefficient "
        "to constants.");
  }

  // We were unable to prove independence or discern any additional information.
  // Must assume <=> direction.
  PrintDebug(
      "WeakCrossingSIVTest was unable to determine any dependence "
      "information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}